

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent
          (QGraphicsProxyWidgetPrivate *this,QGraphicsSceneHoverEvent *event)

{
  bool bVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneMouseEvent mouseEvent;
  QGraphicsSceneMouseEvent *in_stack_00000078;
  QGraphicsProxyWidgetPrivate *in_stack_00000080;
  QGraphicsSceneEvent *in_stack_ffffffffffffff90;
  QEvent *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QEvent *)&local_28;
  QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
            ((QGraphicsSceneMouseEvent *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (Type)((ulong)this_00 >> 0x20));
  QGraphicsSceneHoverEvent::pos((QGraphicsSceneHoverEvent *)this_00);
  QGraphicsSceneMouseEvent::setPos((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff90,in_RDI);
  QGraphicsSceneHoverEvent::screenPos((QGraphicsSceneHoverEvent *)in_stack_ffffffffffffff90);
  QGraphicsSceneMouseEvent::setScreenPos
            ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff90,(QPoint *)in_RDI);
  QGraphicsSceneMouseEvent::setButton
            ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff90,
             (MouseButton)((ulong)in_RDI >> 0x20));
  QFlags<Qt::MouseButton>::QFlags((QFlags<Qt::MouseButton> *)0x9b8369);
  QGraphicsSceneMouseEvent::setButtons
            ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff90,
             (QFlagsStorageHelper<Qt::MouseButton,_4>)SUB84((ulong)this_00 >> 0x20,0));
  QGraphicsSceneHoverEvent::modifiers((QGraphicsSceneHoverEvent *)in_stack_ffffffffffffff90);
  QGraphicsSceneMouseEvent::setModifiers
            ((QGraphicsSceneMouseEvent *)in_stack_ffffffffffffff90,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)this_00 >> 0x20,0));
  QGraphicsSceneEvent::timestamp((QGraphicsSceneEvent *)0x9b839d);
  QGraphicsSceneEvent::setTimestamp(in_stack_ffffffffffffff90,(quint64)in_RDI);
  sendWidgetMouseEvent(in_stack_00000080,in_stack_00000078);
  bVar1 = QEvent::isAccepted(this_00);
  (**(code **)(*in_RSI + 0x10))(in_RSI,bVar1,extraout_RDX,bVar1);
  QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0x9b83e9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidgetPrivate::sendWidgetMouseEvent(QGraphicsSceneHoverEvent *event)
{
    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseMove);
    mouseEvent.setPos(event->pos());
    mouseEvent.setScreenPos(event->screenPos());
    mouseEvent.setButton(Qt::NoButton);
    mouseEvent.setButtons({ });
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setTimestamp(event->timestamp());
    sendWidgetMouseEvent(&mouseEvent);
    event->setAccepted(mouseEvent.isAccepted());
}